

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  Geometry *pGVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined1 auVar12 [12];
  uint uVar13;
  undefined4 uVar14;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  RTCIntersectArguments *pRVar20;
  ulong uVar21;
  long lVar22;
  Intersectors *pIVar23;
  Intersectors *pIVar24;
  NodeRef root;
  size_t sVar25;
  Ref<embree::Geometry> *pRVar26;
  ulong uVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar28;
  NodeRef *pNVar29;
  bool bVar30;
  float fVar42;
  vint4 bi_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar43;
  float fVar44;
  uint uVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar46;
  undefined1 auVar47 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar48;
  float fVar53;
  float fVar56;
  float fVar57;
  vint4 bi;
  float fVar58;
  undefined1 auVar54 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar55;
  float fVar59;
  float fVar61;
  float fVar62;
  vint4 ai;
  undefined1 auVar60 [16];
  float fVar63;
  float fVar64;
  float fVar67;
  float fVar68;
  vint4 ai_1;
  undefined1 auVar65 [16];
  float fVar69;
  undefined1 auVar66 [16];
  float fVar70;
  float fVar73;
  float fVar74;
  vint4 ai_3;
  undefined1 auVar71 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  float fVar78;
  float fVar79;
  uint uVar83;
  uint uVar84;
  vint4 bi_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar85;
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 bi_3;
  float fVar89;
  uint uVar90;
  float fVar91;
  float fVar92;
  uint uVar95;
  float fVar96;
  uint uVar97;
  float fVar98;
  vint4 ai_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  int iVar113;
  float fVar114;
  int iVar115;
  float fVar116;
  int iVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  Precalculations pre;
  vbool<4> terminated;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  size_t sVar15;
  undefined1 auVar45 [16];
  
  bvh = (BVH *)This->ptr;
  sVar15 = (bvh->root).ptr;
  if (sVar15 != 8) {
    pRVar20 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar20 = context->args,
       (pRVar20->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar60 = *(undefined1 (*) [16])(ray + 0x80);
    auVar65._0_12_ = ZEXT812(0);
    auVar65._12_4_ = 0;
    uVar43 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar60._0_4_);
    uVar49 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar60._4_4_);
    auVar45._0_8_ = CONCAT44(uVar49,uVar43);
    auVar45._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar60._8_4_);
    auVar45._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar60._12_4_);
    iVar18 = movmskps((int)pRVar20,auVar45);
    if (iVar18 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar44 = (float)DAT_01f80d30;
      fVar50 = DAT_01f80d30._4_4_;
      fVar51 = DAT_01f80d30._8_4_;
      fVar52 = DAT_01f80d30._12_4_;
      auVar32._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar50);
      auVar32._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar44);
      auVar32._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar51);
      auVar32._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar52);
      auVar93 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar32)
      ;
      auVar71._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar50);
      auVar71._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar44);
      auVar71._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar51);
      auVar71._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar52);
      auVar80 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar71)
      ;
      auVar31._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar50);
      auVar31._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar44);
      auVar31._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar51);
      auVar31._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar52);
      auVar71 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar31)
      ;
      auVar32 = rcpps(auVar31,auVar93);
      fVar44 = auVar32._0_4_;
      auVar94._0_4_ = auVar93._0_4_ * fVar44;
      fVar50 = auVar32._4_4_;
      auVar94._4_4_ = auVar93._4_4_ * fVar50;
      fVar51 = auVar32._8_4_;
      auVar94._8_4_ = auVar93._8_4_ * fVar51;
      fVar52 = auVar32._12_4_;
      auVar94._12_4_ = auVar93._12_4_ * fVar52;
      tray.rdir.field_0._0_4_ = (1.0 - auVar94._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._4_4_ = (1.0 - auVar94._4_4_) * fVar50 + fVar50;
      tray.rdir.field_0._8_4_ = (1.0 - auVar94._8_4_) * fVar51 + fVar51;
      tray.rdir.field_0._12_4_ = (1.0 - auVar94._12_4_) * fVar52 + fVar52;
      auVar32 = rcpps(auVar94,auVar80);
      fVar44 = auVar32._0_4_;
      auVar81._0_4_ = auVar80._0_4_ * fVar44;
      fVar50 = auVar32._4_4_;
      auVar81._4_4_ = auVar80._4_4_ * fVar50;
      fVar51 = auVar32._8_4_;
      auVar81._8_4_ = auVar80._8_4_ * fVar51;
      fVar52 = auVar32._12_4_;
      auVar81._12_4_ = auVar80._12_4_ * fVar52;
      tray.rdir.field_0._16_4_ = (1.0 - auVar81._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._20_4_ = (1.0 - auVar81._4_4_) * fVar50 + fVar50;
      tray.rdir.field_0._24_4_ = (1.0 - auVar81._8_4_) * fVar51 + fVar51;
      tray.rdir.field_0._28_4_ = (1.0 - auVar81._12_4_) * fVar52 + fVar52;
      auVar32 = rcpps(auVar81,auVar71);
      fVar44 = auVar32._0_4_;
      fVar50 = auVar32._4_4_;
      fVar51 = auVar32._8_4_;
      fVar52 = auVar32._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar71._0_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._36_4_ = (1.0 - auVar71._4_4_ * fVar50) * fVar50 + fVar50;
      tray.rdir.field_0._40_4_ = (1.0 - auVar71._8_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._44_4_ = (1.0 - auVar71._12_4_ * fVar52) * fVar52 + fVar52;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar80._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar80._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar80._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar80._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar80);
      auVar93._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar93._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar93._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar93._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar93);
      auVar32 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar65);
      auVar60 = maxps(auVar60,auVar65);
      iVar18 = (int)DAT_01f7a9f0;
      iVar113 = DAT_01f7a9f0._4_4_;
      iVar115 = DAT_01f7a9f0._8_4_;
      iVar117 = DAT_01f7a9f0._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar32,auVar45);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar60,auVar45);
      terminated.field_0._0_8_ = auVar45._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar45._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar45._12_4_ ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar21 = 3;
      }
      else {
        uVar21 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar29 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar28 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar15;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00233e16:
      do {
        do {
          root.ptr = pNVar29[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00234894;
          pNVar29 = pNVar29 + -1;
          paVar28 = paVar28 + -1;
          aVar46.v = *(__m128 *)paVar28->v;
          auVar60._4_4_ = -(uint)(aVar46.v[1] < tray.tfar.field_0.v[1]);
          auVar60._0_4_ = -(uint)(aVar46.v[0] < tray.tfar.field_0.v[0]);
          auVar60._8_4_ = -(uint)(aVar46.v[2] < tray.tfar.field_0.v[2]);
          auVar60._12_4_ = -(uint)(aVar46._12_4_ < tray.tfar.field_0.v[3]);
          uVar13 = movmskps((int)sVar15,auVar60);
          sVar15 = (size_t)uVar13;
        } while (uVar13 == 0);
        uVar17 = (ulong)(byte)uVar13;
        uVar16 = (ulong)(uint)POPCOUNT(uVar13 & 0xff);
        sVar15 = uVar16;
        if (uVar21 < uVar16) {
LAB_00233e56:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00234894;
              auVar35._4_4_ = -(uint)(aVar46.v[1] < tray.tfar.field_0.v[1]);
              auVar35._0_4_ = -(uint)(aVar46.v[0] < tray.tfar.field_0.v[0]);
              auVar35._8_4_ = -(uint)(aVar46.v[2] < tray.tfar.field_0.v[2]);
              auVar35._12_4_ = -(uint)(aVar46.v[3] < tray.tfar.field_0.v[3]);
              uVar13 = movmskps((int)sVar15,auVar35);
              sVar15 = (size_t)uVar13;
              if (uVar13 == 0) goto LAB_00233e16;
              uVar16 = (ulong)((uint)root.ptr & 0xf) - 8;
              aVar48 = terminated.field_0;
              if (uVar16 == 0) goto LAB_0023477a;
              auVar47._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar47._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar47._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              uVar11 = *(undefined8 *)(ray + 0x40);
              auVar12 = *(undefined1 (*) [12])(ray + 0x40);
              local_1878 = (float)uVar11;
              fStack_1874 = (float)((ulong)uVar11 >> 0x20);
              fStack_1870 = (float)*(undefined8 *)(ray + 0x48);
              fStack_186c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
              lVar22 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar17 = 0;
              goto LAB_002340da;
            }
            lVar22 = 0;
            aVar46.i[1] = iVar113;
            aVar46.i[0] = iVar18;
            aVar46.i[2] = iVar115;
            aVar46.i[3] = iVar117;
            sVar15 = 8;
            do {
              sVar1 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar22 * 8);
              sVar25 = sVar15;
              if (sVar1 == 8) break;
              fVar44 = *(float *)(root.ptr + 0x20 + lVar22 * 4);
              fVar50 = *(float *)(root.ptr + 0x30 + lVar22 * 4);
              fVar51 = *(float *)(root.ptr + 0x40 + lVar22 * 4);
              fVar52 = *(float *)(root.ptr + 0x50 + lVar22 * 4);
              fVar59 = (fVar44 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar61 = (fVar44 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar62 = (fVar44 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar63 = (fVar44 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar64 = (fVar51 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar67 = (fVar51 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar68 = (fVar51 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar69 = (fVar51 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar44 = *(float *)(root.ptr + 0x60 + lVar22 * 4);
              fVar70 = (fVar44 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar73 = (fVar44 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar74 = (fVar44 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar76 = (fVar44 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              fVar53 = (fVar50 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar56 = (fVar50 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar57 = (fVar50 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar58 = (fVar50 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar50 = (fVar52 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar51 = (fVar52 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar42 = (fVar52 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar52 = (fVar52 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar44 = *(float *)(root.ptr + 0x70 + lVar22 * 4);
              fVar86 = (fVar44 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar87 = (fVar44 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar88 = (fVar44 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar44 = (fVar44 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              uVar13 = (uint)((int)fVar53 < (int)fVar59) * (int)fVar53 |
                       (uint)((int)fVar53 >= (int)fVar59) * (int)fVar59;
              uVar83 = (uint)((int)fVar56 < (int)fVar61) * (int)fVar56 |
                       (uint)((int)fVar56 >= (int)fVar61) * (int)fVar61;
              uVar84 = (uint)((int)fVar57 < (int)fVar62) * (int)fVar57 |
                       (uint)((int)fVar57 >= (int)fVar62) * (int)fVar62;
              uVar85 = (uint)((int)fVar58 < (int)fVar63) * (int)fVar58 |
                       (uint)((int)fVar58 >= (int)fVar63) * (int)fVar63;
              uVar90 = (uint)((int)fVar50 < (int)fVar64) * (int)fVar50 |
                       (uint)((int)fVar50 >= (int)fVar64) * (int)fVar64;
              uVar95 = (uint)((int)fVar51 < (int)fVar67) * (int)fVar51 |
                       (uint)((int)fVar51 >= (int)fVar67) * (int)fVar67;
              uVar97 = (uint)((int)fVar42 < (int)fVar68) * (int)fVar42 |
                       (uint)((int)fVar42 >= (int)fVar68) * (int)fVar68;
              uVar99 = (uint)((int)fVar52 < (int)fVar69) * (int)fVar52 |
                       (uint)((int)fVar52 >= (int)fVar69) * (int)fVar69;
              uVar90 = ((int)uVar90 < (int)uVar13) * uVar13 | ((int)uVar90 >= (int)uVar13) * uVar90;
              uVar95 = ((int)uVar95 < (int)uVar83) * uVar83 | ((int)uVar95 >= (int)uVar83) * uVar95;
              uVar97 = ((int)uVar97 < (int)uVar84) * uVar84 | ((int)uVar97 >= (int)uVar84) * uVar97;
              uVar99 = ((int)uVar99 < (int)uVar85) * uVar85 | ((int)uVar99 >= (int)uVar85) * uVar99;
              uVar13 = (uint)((int)fVar86 < (int)fVar70) * (int)fVar86 |
                       (uint)((int)fVar86 >= (int)fVar70) * (int)fVar70;
              uVar83 = (uint)((int)fVar87 < (int)fVar73) * (int)fVar87 |
                       (uint)((int)fVar87 >= (int)fVar73) * (int)fVar73;
              uVar84 = (uint)((int)fVar88 < (int)fVar74) * (int)fVar88 |
                       (uint)((int)fVar88 >= (int)fVar74) * (int)fVar74;
              uVar85 = (uint)((int)fVar44 < (int)fVar76) * (int)fVar44 |
                       (uint)((int)fVar44 >= (int)fVar76) * (int)fVar76;
              auVar82._0_4_ =
                   ((int)uVar13 < (int)uVar90) * uVar90 | ((int)uVar13 >= (int)uVar90) * uVar13;
              auVar82._4_4_ =
                   ((int)uVar83 < (int)uVar95) * uVar95 | ((int)uVar83 >= (int)uVar95) * uVar83;
              auVar82._8_4_ =
                   ((int)uVar84 < (int)uVar97) * uVar97 | ((int)uVar84 >= (int)uVar97) * uVar84;
              auVar82._12_4_ =
                   ((int)uVar85 < (int)uVar99) * uVar99 | ((int)uVar85 >= (int)uVar99) * uVar85;
              uVar90 = (uint)((int)fVar53 < (int)fVar59) * (int)fVar59 |
                       (uint)((int)fVar53 >= (int)fVar59) * (int)fVar53;
              uVar95 = (uint)((int)fVar56 < (int)fVar61) * (int)fVar61 |
                       (uint)((int)fVar56 >= (int)fVar61) * (int)fVar56;
              uVar97 = (uint)((int)fVar57 < (int)fVar62) * (int)fVar62 |
                       (uint)((int)fVar57 >= (int)fVar62) * (int)fVar57;
              uVar99 = (uint)((int)fVar58 < (int)fVar63) * (int)fVar63 |
                       (uint)((int)fVar58 >= (int)fVar63) * (int)fVar58;
              uVar13 = (uint)((int)fVar50 < (int)fVar64) * (int)fVar64 |
                       (uint)((int)fVar50 >= (int)fVar64) * (int)fVar50;
              uVar83 = (uint)((int)fVar51 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar51 >= (int)fVar67) * (int)fVar51;
              uVar84 = (uint)((int)fVar42 < (int)fVar68) * (int)fVar68 |
                       (uint)((int)fVar42 >= (int)fVar68) * (int)fVar42;
              uVar85 = (uint)((int)fVar52 < (int)fVar69) * (int)fVar69 |
                       (uint)((int)fVar52 >= (int)fVar69) * (int)fVar52;
              uVar13 = ((int)uVar90 < (int)uVar13) * uVar90 | ((int)uVar90 >= (int)uVar13) * uVar13;
              uVar83 = ((int)uVar95 < (int)uVar83) * uVar95 | ((int)uVar95 >= (int)uVar83) * uVar83;
              uVar84 = ((int)uVar97 < (int)uVar84) * uVar97 | ((int)uVar97 >= (int)uVar84) * uVar84;
              uVar85 = ((int)uVar99 < (int)uVar85) * uVar99 | ((int)uVar99 >= (int)uVar85) * uVar85;
              uVar90 = (uint)((int)fVar86 < (int)fVar70) * (int)fVar70 |
                       (uint)((int)fVar86 >= (int)fVar70) * (int)fVar86;
              uVar95 = (uint)((int)fVar87 < (int)fVar73) * (int)fVar73 |
                       (uint)((int)fVar87 >= (int)fVar73) * (int)fVar87;
              uVar97 = (uint)((int)fVar88 < (int)fVar74) * (int)fVar74 |
                       (uint)((int)fVar88 >= (int)fVar74) * (int)fVar88;
              uVar99 = (uint)((int)fVar44 < (int)fVar76) * (int)fVar76 |
                       (uint)((int)fVar44 >= (int)fVar76) * (int)fVar44;
              uVar13 = ((int)uVar13 < (int)uVar90) * uVar13 | ((int)uVar13 >= (int)uVar90) * uVar90;
              uVar83 = ((int)uVar83 < (int)uVar95) * uVar83 | ((int)uVar83 >= (int)uVar95) * uVar95;
              uVar84 = ((int)uVar84 < (int)uVar97) * uVar84 | ((int)uVar84 >= (int)uVar97) * uVar97;
              uVar85 = ((int)uVar85 < (int)uVar99) * uVar85 | ((int)uVar85 >= (int)uVar99) * uVar99;
              auVar33._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar82._4_4_) * auVar82._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar82._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar83) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar83) * uVar83));
              auVar33._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar82._0_4_) * auVar82._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar82._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar13) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar13) * uVar13));
              auVar33._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar82._8_4_) * auVar82._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar82._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar84) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar84) * uVar84));
              auVar33._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar82._12_4_) * auVar82._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar82._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar85) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar85) * uVar85));
              uVar13 = movmskps((int)valid_i,auVar33);
              valid_i = (vint<4> *)(ulong)uVar13;
              aVar55 = aVar46;
              if ((uVar13 != 0) &&
                 (auVar54._4_4_ = iVar113, auVar54._0_4_ = iVar18, auVar54._8_4_ = iVar115,
                 auVar54._12_4_ = iVar117,
                 aVar55 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar54,auVar82,auVar33), sVar25 = sVar1, sVar15 != 8)) {
                pNVar29->ptr = sVar15;
                pNVar29 = pNVar29 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar28->v = aVar46;
                paVar28 = paVar28 + 1;
              }
              aVar46 = aVar55;
              lVar22 = lVar22 + 1;
              sVar15 = sVar25;
            } while (lVar22 != 4);
            if (sVar25 == 8) goto LAB_00233ff3;
            auVar34._4_4_ = -(uint)(aVar46.v[1] < tray.tfar.field_0.v[1]);
            auVar34._0_4_ = -(uint)(aVar46.v[0] < tray.tfar.field_0.v[0]);
            auVar34._8_4_ = -(uint)(aVar46.v[2] < tray.tfar.field_0.v[2]);
            auVar34._12_4_ = -(uint)(aVar46.v[3] < tray.tfar.field_0.v[3]);
            uVar14 = movmskps((uint)root.ptr,auVar34);
            sVar15 = (size_t)(uint)POPCOUNT(uVar14);
            root.ptr = sVar25;
          } while ((byte)uVar21 < (byte)POPCOUNT(uVar14));
          pNVar29->ptr = sVar25;
          pNVar29 = pNVar29 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar28->v = aVar46;
          paVar28 = paVar28 + 1;
LAB_00233ff3:
          sVar15 = 4;
        }
        else {
          do {
            sVar15 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> sVar15 & 1) == 0; sVar15 = sVar15 + 1) {
              }
            }
            valid_i = (vint<4> *)This;
            bVar30 = occluded1(This,bvh,root,sVar15,&pre,ray,&tray,context);
            if (bVar30) {
              terminated.field_0.i[sVar15] = -1;
            }
            uVar17 = uVar17 & uVar17 - 1;
          } while (uVar17 != 0);
          iVar18 = movmskps(0,(undefined1  [16])terminated.field_0);
          sVar15 = 3;
          if (iVar18 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            sVar15 = 2;
          }
          iVar18 = 0x7f800000;
          iVar113 = 0x7f800000;
          iVar115 = 0x7f800000;
          iVar117 = 0x7f800000;
          if (uVar21 < uVar16) goto LAB_00233e56;
        }
      } while ((int)sVar15 != 3);
LAB_00234894:
      auVar41._0_4_ = uVar43 & terminated.field_0.i[0];
      auVar41._4_4_ = uVar49 & terminated.field_0.i[1];
      auVar41._8_4_ = auVar45._8_4_ & terminated.field_0.i[2];
      auVar41._12_4_ = auVar45._12_4_ & terminated.field_0.i[3];
      auVar60 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar41);
      *(undefined1 (*) [16])(ray + 0x80) = auVar60;
    }
  }
  return;
  while( true ) {
    uVar17 = uVar17 + 1;
    lVar22 = lVar22 + 0xe0;
    if (uVar16 <= uVar17) break;
LAB_002340da:
    uVar90 = auVar47._4_4_;
    uVar95 = auVar47._8_4_;
    uVar97 = auVar47._12_4_;
    pIVar23 = (Intersectors *)0x0;
    uVar13 = auVar47._0_4_;
    uVar83 = uVar90;
    uVar84 = uVar95;
    uVar85 = uVar97;
    while (uVar27 = (ulong)*(uint *)(lVar22 + (long)pIVar23 * 4), pIVar24 = pIVar23,
          uVar27 != 0xffffffff) {
      fVar44 = *(float *)(lVar22 + -0xc0 + (long)pIVar23 * 4);
      fVar50 = *(float *)(lVar22 + -0xb0 + (long)pIVar23 * 4);
      fVar51 = *(float *)(lVar22 + -0xa0 + (long)pIVar23 * 4);
      fVar52 = *(float *)(lVar22 + -0x90 + (long)pIVar23 * 4);
      fVar42 = *(float *)(lVar22 + -0x80 + (long)pIVar23 * 4);
      fVar53 = *(float *)(lVar22 + -0x70 + (long)pIVar23 * 4);
      fVar56 = *(float *)(lVar22 + -0x30 + (long)pIVar23 * 4);
      fVar57 = *(float *)(lVar22 + -0x20 + (long)pIVar23 * 4);
      fVar58 = *(float *)(lVar22 + -0x10 + (long)pIVar23 * 4);
      fVar86 = fVar57 - fVar50;
      fVar119 = fVar50 - fVar42;
      fVar78 = fVar58 - fVar51;
      fVar103 = fVar51 - fVar53;
      fVar111 = fVar103 * fVar86 - fVar119 * fVar78;
      fVar101 = fVar56 - fVar44;
      fVar91 = fVar44 - fVar52;
      fVar79 = fVar78 * fVar91 - fVar103 * fVar101;
      fVar102 = fVar101 * fVar119 - fVar86 * fVar91;
      local_1908 = (float)*(undefined8 *)(ray + 0x10);
      fStack_1904 = (float)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      fStack_1900 = (float)*(undefined8 *)(ray + 0x18);
      fStack_18fc = (float)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      fVar68 = fVar50 - local_1908;
      fVar69 = fVar50 - fStack_1904;
      fVar70 = fVar50 - fStack_1900;
      fVar50 = fVar50 - fStack_18fc;
      local_1848 = (float)*(undefined8 *)(ray + 0x20);
      fStack_1844 = (float)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      fStack_1840 = (float)*(undefined8 *)(ray + 0x28);
      fStack_183c = (float)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      fVar59 = fVar51 - local_1848;
      fVar61 = fVar51 - fStack_1844;
      fVar62 = fVar51 - fStack_1840;
      fVar51 = fVar51 - fStack_183c;
      local_1858 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1854 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1850 = (float)*(undefined8 *)(ray + 0x58);
      fStack_184c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_1868 = (float)*(undefined8 *)(ray + 0x60);
      fStack_1864 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_1860 = (float)*(undefined8 *)(ray + 0x68);
      fStack_185c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar87 = fVar68 * local_1868 - fVar59 * local_1858;
      fVar88 = fVar69 * fStack_1864 - fVar61 * fStack_1854;
      fVar75 = fVar70 * fStack_1860 - fVar62 * fStack_1850;
      fVar77 = fVar50 * fStack_185c - fVar51 * fStack_184c;
      local_18f8 = (float)*(undefined8 *)ray;
      fStack_18f4 = (float)((ulong)*(undefined8 *)ray >> 0x20);
      fStack_18f0 = (float)*(undefined8 *)(ray + 8);
      fStack_18ec = (float)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      fVar63 = fVar44 - local_18f8;
      fVar64 = fVar44 - fStack_18f4;
      fVar67 = fVar44 - fStack_18f0;
      fVar44 = fVar44 - fStack_18ec;
      fVar73 = auVar12._0_4_;
      fVar74 = auVar12._4_4_;
      fVar76 = auVar12._8_4_;
      fVar92 = fVar59 * fVar73 - fVar63 * local_1868;
      fVar96 = fVar61 * fVar74 - fVar64 * fStack_1864;
      fVar98 = fVar62 * fVar76 - fVar67 * fStack_1860;
      fVar100 = fVar51 * fStack_186c - fVar44 * fStack_185c;
      fVar120 = fVar63 * local_1858 - fVar68 * fVar73;
      fVar122 = fVar64 * fStack_1854 - fVar69 * fVar74;
      fVar124 = fVar67 * fStack_1850 - fVar70 * fVar76;
      fVar126 = fVar44 * fStack_184c - fVar50 * fStack_186c;
      fVar73 = fVar111 * fVar73 + local_1858 * fVar79 + fVar102 * local_1868;
      fVar74 = fVar111 * fVar74 + fStack_1854 * fVar79 + fVar102 * fStack_1864;
      fVar76 = fVar111 * fVar76 + fStack_1850 * fVar79 + fVar102 * fStack_1860;
      fVar89 = fVar111 * fStack_186c + fStack_184c * fVar79 + fVar102 * fStack_185c;
      uVar99 = (uint)fVar73 & 0x80000000;
      uVar104 = (uint)fVar74 & 0x80000000;
      uVar105 = (uint)fVar76 & 0x80000000;
      uVar106 = (uint)fVar89 & 0x80000000;
      fVar107 = (float)((uint)(fVar101 * fVar87 + fVar86 * fVar92 + fVar78 * fVar120) ^ uVar99);
      fVar108 = (float)((uint)(fVar101 * fVar88 + fVar86 * fVar96 + fVar78 * fVar122) ^ uVar104);
      fVar109 = (float)((uint)(fVar101 * fVar75 + fVar86 * fVar98 + fVar78 * fVar124) ^ uVar105);
      fVar86 = (float)((uint)(fVar101 * fVar77 + fVar86 * fVar100 + fVar78 * fVar126) ^ uVar106);
      uVar128 = -(uint)(0.0 <= fVar107) & uVar13;
      uVar129 = -(uint)(0.0 <= fVar108) & uVar83;
      uVar130 = -(uint)(0.0 <= fVar109) & uVar84;
      uVar131 = -(uint)(0.0 <= fVar86) & uVar85;
      auVar9._4_4_ = uVar129;
      auVar9._0_4_ = uVar128;
      auVar9._8_4_ = uVar130;
      auVar9._12_4_ = uVar131;
      iVar18 = movmskps((int)valid_i,auVar9);
      local_1888 = (float)*(undefined8 *)(ray + 0x30);
      fStack_1884 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_1880 = (float)*(undefined8 *)(ray + 0x38);
      fStack_187c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_1898 = (float)*(undefined8 *)(ray + 0x80);
      fStack_1894 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_1890 = (float)*(undefined8 *)(ray + 0x88);
      fStack_188c = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if (iVar18 != 0) {
        fVar87 = (float)((uint)(fVar91 * fVar87 + fVar119 * fVar92 + fVar103 * fVar120) ^ uVar99);
        fVar88 = (float)((uint)(fVar91 * fVar88 + fVar119 * fVar96 + fVar103 * fVar122) ^ uVar104);
        fVar75 = (float)((uint)(fVar91 * fVar75 + fVar119 * fVar98 + fVar103 * fVar124) ^ uVar105);
        fVar77 = (float)((uint)(fVar91 * fVar77 + fVar119 * fVar100 + fVar103 * fVar126) ^ uVar106);
        auVar72._0_4_ = -(uint)(0.0 <= fVar87) & uVar128;
        auVar72._4_4_ = -(uint)(0.0 <= fVar88) & uVar129;
        auVar72._8_4_ = -(uint)(0.0 <= fVar75) & uVar130;
        auVar72._12_4_ = -(uint)(0.0 <= fVar77) & uVar131;
        iVar18 = movmskps(iVar18,auVar72);
        if (iVar18 != 0) {
          fVar78 = ABS(fVar73);
          fVar91 = ABS(fVar74);
          fVar92 = ABS(fVar76);
          fVar96 = ABS(fVar89);
          auVar36._0_4_ = -(uint)(fVar87 <= fVar78 - fVar107) & auVar72._0_4_;
          auVar36._4_4_ = -(uint)(fVar88 <= fVar91 - fVar108) & auVar72._4_4_;
          auVar36._8_4_ = -(uint)(fVar75 <= fVar92 - fVar109) & auVar72._8_4_;
          auVar36._12_4_ = -(uint)(fVar77 <= fVar96 - fVar86) & auVar72._12_4_;
          iVar18 = movmskps(iVar18,auVar36);
          if (iVar18 != 0) {
            fVar59 = (float)(uVar99 ^ (uint)(fVar63 * fVar111 + fVar68 * fVar79 + fVar102 * fVar59))
            ;
            fVar61 = (float)(uVar104 ^ (uint)(fVar64 * fVar111 + fVar69 * fVar79 + fVar102 * fVar61)
                            );
            fVar62 = (float)(uVar105 ^ (uint)(fVar67 * fVar111 + fVar70 * fVar79 + fVar102 * fVar62)
                            );
            fVar44 = (float)(uVar106 ^ (uint)(fVar44 * fVar111 + fVar50 * fVar79 + fVar102 * fVar51)
                            );
            uVar99 = -(uint)(fVar59 <= fVar78 * local_1898 && fVar78 * local_1888 < fVar59) &
                     auVar36._0_4_;
            uVar104 = -(uint)(fVar61 <= fVar91 * fStack_1894 && fVar91 * fStack_1884 < fVar61) &
                      auVar36._4_4_;
            uVar105 = -(uint)(fVar62 <= fVar92 * fStack_1890 && fVar92 * fStack_1880 < fVar62) &
                      auVar36._8_4_;
            uVar106 = -(uint)(fVar44 <= fVar96 * fStack_188c && fVar96 * fStack_187c < fVar44) &
                      auVar36._12_4_;
            auVar5._4_4_ = uVar104;
            auVar5._0_4_ = uVar99;
            auVar5._8_4_ = uVar105;
            auVar5._12_4_ = uVar106;
            iVar18 = movmskps(iVar18,auVar5);
            if (iVar18 != 0) {
              uVar99 = -(uint)(fVar73 != 0.0) & uVar99;
              uVar104 = -(uint)(fVar74 != 0.0) & uVar104;
              uVar105 = -(uint)(fVar76 != 0.0) & uVar105;
              uVar106 = -(uint)(fVar89 != 0.0) & uVar106;
              auVar3._4_4_ = uVar104;
              auVar3._0_4_ = uVar99;
              auVar3._8_4_ = uVar105;
              auVar3._12_4_ = uVar106;
              iVar18 = movmskps(iVar18,auVar3);
              if (iVar18 != 0) {
                pGVar2 = (context->scene->geometries).items[uVar27].ptr;
                uVar128 = pGVar2->mask;
                auVar37._0_4_ = -(uint)((uVar128 & *(uint *)(ray + 0x90)) == 0);
                auVar37._4_4_ = -(uint)((uVar128 & *(uint *)(ray + 0x94)) == 0);
                auVar37._8_4_ = -(uint)((uVar128 & *(uint *)(ray + 0x98)) == 0);
                auVar37._12_4_ = -(uint)((uVar128 & *(uint *)(ray + 0x9c)) == 0);
                auVar38._4_4_ = uVar104;
                auVar38._0_4_ = uVar99;
                auVar38._8_4_ = uVar105;
                auVar38._12_4_ = uVar106;
                auVar38 = ~auVar37 & auVar38;
                iVar18 = movmskps((int)pGVar2,auVar38);
                if (iVar18 != 0) {
                  uVar13 = ~auVar38._0_4_ & uVar13;
                  uVar83 = ~auVar38._4_4_ & uVar83;
                  uVar84 = ~auVar38._8_4_ & uVar84;
                  uVar85 = ~auVar38._12_4_ & uVar85;
                }
              }
            }
          }
        }
      }
      auVar7._4_4_ = uVar83;
      auVar7._0_4_ = uVar13;
      auVar7._8_4_ = uVar84;
      auVar7._12_4_ = uVar85;
      uVar99 = movmskps(iVar18,auVar7);
      if (uVar99 == 0) {
        iVar18 = 0x7f800000;
        iVar113 = 0x7f800000;
        iVar115 = 0x7f800000;
        iVar117 = 0x7f800000;
        valid_i = (vint<4> *)(ulong)uVar99;
        break;
      }
      fVar44 = *(float *)(lVar22 + -0x60 + (long)pIVar23 * 4);
      fVar50 = *(float *)(lVar22 + -0x50 + (long)pIVar23 * 4);
      fVar51 = *(float *)(lVar22 + -0x40 + (long)pIVar23 * 4);
      fVar107 = fVar44 - fVar56;
      fVar108 = fVar44 - fVar56;
      fVar109 = fVar44 - fVar56;
      fVar56 = fVar44 - fVar56;
      fVar111 = fVar50 - fVar57;
      fVar120 = fVar50 - fVar57;
      fVar124 = fVar50 - fVar57;
      fVar57 = fVar50 - fVar57;
      fVar78 = fVar51 - fVar58;
      fVar89 = fVar51 - fVar58;
      fVar92 = fVar51 - fVar58;
      fVar58 = fVar51 - fVar58;
      fVar88 = fVar52 - fVar44;
      fVar75 = fVar52 - fVar44;
      fVar77 = fVar52 - fVar44;
      fVar52 = fVar52 - fVar44;
      fVar64 = fVar42 - fVar50;
      fVar67 = fVar42 - fVar50;
      fVar68 = fVar42 - fVar50;
      fVar42 = fVar42 - fVar50;
      fVar76 = fVar53 - fVar51;
      fVar86 = fVar53 - fVar51;
      fVar87 = fVar53 - fVar51;
      fVar53 = fVar53 - fVar51;
      fVar100 = fVar64 * fVar78 - fVar76 * fVar111;
      fVar101 = fVar67 * fVar89 - fVar86 * fVar120;
      fVar102 = fVar68 * fVar92 - fVar87 * fVar124;
      fVar103 = fVar42 * fVar58 - fVar53 * fVar57;
      fVar79 = fVar76 * fVar107 - fVar88 * fVar78;
      fVar91 = fVar86 * fVar108 - fVar75 * fVar89;
      fVar96 = fVar87 * fVar109 - fVar77 * fVar92;
      fVar98 = fVar53 * fVar56 - fVar52 * fVar58;
      fVar59 = fVar88 * fVar111 - fVar64 * fVar107;
      fVar61 = fVar75 * fVar120 - fVar67 * fVar108;
      fVar62 = fVar77 * fVar124 - fVar68 * fVar109;
      fVar63 = fVar52 * fVar57 - fVar42 * fVar56;
      local_18f8 = fVar44 - local_18f8;
      fStack_18f4 = fVar44 - fStack_18f4;
      fStack_18f0 = fVar44 - fStack_18f0;
      fVar44 = fVar44 - fStack_18ec;
      local_1908 = fVar50 - local_1908;
      fStack_1904 = fVar50 - fStack_1904;
      fStack_1900 = fVar50 - fStack_1900;
      fVar50 = fVar50 - fStack_18fc;
      local_1848 = fVar51 - local_1848;
      fStack_1844 = fVar51 - fStack_1844;
      fStack_1840 = fVar51 - fStack_1840;
      fVar51 = fVar51 - fStack_183c;
      fVar119 = local_1908 * local_1868 - local_1848 * local_1858;
      fVar122 = fStack_1904 * fStack_1864 - fStack_1844 * fStack_1854;
      fVar126 = fStack_1900 * fStack_1860 - fStack_1840 * fStack_1850;
      fVar110 = fVar50 * fStack_185c - fVar51 * fStack_184c;
      fVar112 = local_1848 * local_1878 - local_18f8 * local_1868;
      fVar114 = fStack_1844 * fStack_1874 - fStack_18f4 * fStack_1864;
      fVar116 = fStack_1840 * fStack_1870 - fStack_18f0 * fStack_1860;
      fVar118 = fVar51 * fStack_186c - fVar44 * fStack_185c;
      fVar121 = local_18f8 * local_1858 - local_1908 * local_1878;
      fVar123 = fStack_18f4 * fStack_1854 - fStack_1904 * fStack_1874;
      fVar125 = fStack_18f0 * fStack_1850 - fStack_1900 * fStack_1870;
      fVar127 = fVar44 * fStack_184c - fVar50 * fStack_186c;
      fVar69 = fVar100 * local_1878 + local_1858 * fVar79 + fVar59 * local_1868;
      fVar70 = fVar101 * fStack_1874 + fStack_1854 * fVar91 + fVar61 * fStack_1864;
      fVar73 = fVar102 * fStack_1870 + fStack_1850 * fVar96 + fVar62 * fStack_1860;
      fVar74 = fVar103 * fStack_186c + fStack_184c * fVar98 + fVar63 * fStack_185c;
      uVar104 = (uint)fVar69 & 0x80000000;
      uVar105 = (uint)fVar70 & 0x80000000;
      uVar106 = (uint)fVar73 & 0x80000000;
      uVar128 = (uint)fVar74 & 0x80000000;
      fVar64 = (float)((uint)(fVar88 * fVar119 + fVar64 * fVar112 + fVar76 * fVar121) ^ uVar104);
      fVar67 = (float)((uint)(fVar75 * fVar122 + fVar67 * fVar114 + fVar86 * fVar123) ^ uVar105);
      fVar68 = (float)((uint)(fVar77 * fVar126 + fVar68 * fVar116 + fVar87 * fVar125) ^ uVar106);
      fVar52 = (float)((uint)(fVar52 * fVar110 + fVar42 * fVar118 + fVar53 * fVar127) ^ uVar128);
      uVar129 = -(uint)(0.0 <= fVar64) & uVar13;
      uVar130 = -(uint)(0.0 <= fVar67) & uVar83;
      uVar131 = -(uint)(0.0 <= fVar68) & uVar84;
      uVar132 = -(uint)(0.0 <= fVar52) & uVar85;
      auVar10._4_4_ = uVar130;
      auVar10._0_4_ = uVar129;
      auVar10._8_4_ = uVar131;
      auVar10._12_4_ = uVar132;
      uVar99 = movmskps(uVar99,auVar10);
      pRVar26 = (Ref<embree::Geometry> *)(ulong)uVar99;
      if (uVar99 == 0) {
LAB_00234496:
        uVar14 = SUB84(pRVar26,0);
      }
      else {
        fVar42 = (float)((uint)(fVar107 * fVar119 + fVar111 * fVar112 + fVar78 * fVar121) ^ uVar104)
        ;
        fVar53 = (float)((uint)(fVar108 * fVar122 + fVar120 * fVar114 + fVar89 * fVar123) ^ uVar105)
        ;
        fVar76 = (float)((uint)(fVar109 * fVar126 + fVar124 * fVar116 + fVar92 * fVar125) ^ uVar106)
        ;
        fVar56 = (float)((uint)(fVar56 * fVar110 + fVar57 * fVar118 + fVar58 * fVar127) ^ uVar128);
        uVar129 = -(uint)(0.0 <= fVar42) & uVar129;
        uVar130 = -(uint)(0.0 <= fVar53) & uVar130;
        uVar131 = -(uint)(0.0 <= fVar76) & uVar131;
        uVar132 = -(uint)(0.0 <= fVar56) & uVar132;
        auVar6._4_4_ = uVar130;
        auVar6._0_4_ = uVar129;
        auVar6._8_4_ = uVar131;
        auVar6._12_4_ = uVar132;
        uVar99 = movmskps(uVar99,auVar6);
        pRVar26 = (Ref<embree::Geometry> *)(ulong)uVar99;
        if (uVar99 == 0) goto LAB_00234496;
        fVar57 = ABS(fVar69);
        fVar58 = ABS(fVar70);
        fVar86 = ABS(fVar73);
        fVar87 = ABS(fVar74);
        auVar66._0_4_ = -(uint)(fVar42 <= fVar57 - fVar64) & uVar129;
        auVar66._4_4_ = -(uint)(fVar53 <= fVar58 - fVar67) & uVar130;
        auVar66._8_4_ = -(uint)(fVar76 <= fVar86 - fVar68) & uVar131;
        auVar66._12_4_ = -(uint)(fVar56 <= fVar87 - fVar52) & uVar132;
        uVar99 = movmskps(uVar99,auVar66);
        pRVar26 = (Ref<embree::Geometry> *)(ulong)uVar99;
        if (uVar99 == 0) goto LAB_00234496;
        fVar52 = (float)(uVar104 ^
                        (uint)(local_18f8 * fVar100 + local_1908 * fVar79 + fVar59 * local_1848));
        fVar42 = (float)(uVar105 ^
                        (uint)(fStack_18f4 * fVar101 + fStack_1904 * fVar91 + fVar61 * fStack_1844))
        ;
        fVar53 = (float)(uVar106 ^
                        (uint)(fStack_18f0 * fVar102 + fStack_1900 * fVar96 + fVar62 * fStack_1840))
        ;
        fVar44 = (float)(uVar128 ^ (uint)(fVar44 * fVar103 + fVar50 * fVar98 + fVar63 * fVar51));
        uVar104 = -(uint)(fVar52 <= fVar57 * local_1898 && fVar57 * local_1888 < fVar52) &
                  auVar66._0_4_;
        uVar105 = -(uint)(fVar42 <= fVar58 * fStack_1894 && fVar58 * fStack_1884 < fVar42) &
                  auVar66._4_4_;
        uVar106 = -(uint)(fVar53 <= fVar86 * fStack_1890 && fVar86 * fStack_1880 < fVar53) &
                  auVar66._8_4_;
        uVar128 = -(uint)(fVar44 <= fVar87 * fStack_188c && fVar87 * fStack_187c < fVar44) &
                  auVar66._12_4_;
        auVar4._4_4_ = uVar105;
        auVar4._0_4_ = uVar104;
        auVar4._8_4_ = uVar106;
        auVar4._12_4_ = uVar128;
        uVar99 = movmskps(uVar99,auVar4);
        pRVar26 = (Ref<embree::Geometry> *)(ulong)uVar99;
        if (uVar99 != 0) {
          auVar40._0_4_ = -(uint)(fVar69 != 0.0) & uVar104;
          auVar40._4_4_ = -(uint)(fVar70 != 0.0) & uVar105;
          auVar40._8_4_ = -(uint)(fVar73 != 0.0) & uVar106;
          auVar40._12_4_ = -(uint)(fVar74 != 0.0) & uVar128;
          uVar99 = movmskps(uVar99,auVar40);
          pRVar26 = (Ref<embree::Geometry> *)(ulong)uVar99;
          if (uVar99 != 0) {
            pRVar26 = (context->scene->geometries).items;
            uVar99 = (pRVar26[uVar27].ptr)->mask;
            auVar39._0_4_ = -(uint)((uVar99 & *(uint *)(ray + 0x90)) == 0);
            auVar39._4_4_ = -(uint)((uVar99 & *(uint *)(ray + 0x94)) == 0);
            auVar39._8_4_ = -(uint)((uVar99 & *(uint *)(ray + 0x98)) == 0);
            auVar39._12_4_ = -(uint)((uVar99 & *(uint *)(ray + 0x9c)) == 0);
            auVar40 = ~auVar39 & auVar40;
            iVar18 = movmskps((int)pRVar26[uVar27].ptr,auVar40);
            if (iVar18 != 0) {
              uVar13 = ~auVar40._0_4_ & uVar13;
              uVar83 = ~auVar40._4_4_ & uVar83;
              uVar84 = ~auVar40._8_4_ & uVar84;
              uVar85 = ~auVar40._12_4_ & uVar85;
              goto LAB_00234496;
            }
          }
        }
        uVar14 = SUB84(pRVar26,0);
      }
      iVar117 = 0x7f800000;
      iVar115 = 0x7f800000;
      iVar113 = 0x7f800000;
      iVar18 = 0x7f800000;
      auVar8._4_4_ = uVar83;
      auVar8._0_4_ = uVar13;
      auVar8._8_4_ = uVar84;
      auVar8._12_4_ = uVar85;
      uVar99 = movmskps(uVar14,auVar8);
      valid_i = (vint<4> *)(ulong)uVar99;
      if ((uVar99 == 0) ||
         (pIVar24 = (Intersectors *)((long)&pIVar23->ptr + 1),
         bVar30 = (Intersectors *)0x2 < pIVar23, pIVar23 = pIVar24, valid_i = (vint<4> *)pIVar24,
         bVar30)) break;
    }
    auVar47._0_4_ = auVar47._0_4_ & uVar13;
    auVar47._4_4_ = uVar90 & uVar83;
    auVar47._8_4_ = uVar95 & uVar84;
    auVar47._12_4_ = uVar97 & uVar85;
    iVar19 = movmskps((int)pIVar24,auVar47);
    if (iVar19 == 0) break;
  }
  uVar17 = CONCAT44(auVar47._4_4_,auVar47._0_4_);
  aVar48._0_8_ = uVar17 ^ 0xffffffffffffffff;
  aVar48._8_4_ = auVar47._8_4_ ^ 0xffffffff;
  aVar48._12_4_ = auVar47._12_4_ ^ 0xffffffff;
LAB_0023477a:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar48);
  uVar13 = movmskps((int)uVar16,(undefined1  [16])terminated.field_0);
  sVar15 = (size_t)uVar13;
  if (uVar13 == 0xf) goto LAB_00234894;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                (undefined1  [16])terminated.field_0);
  goto LAB_00233e16;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }